

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::
insert<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::const_iterator>
          (Map<google::protobuf::MapKey,google::protobuf::MapValueRef> *this,const_iterator first,
          const_iterator last)

{
  value_type *key;
  MapValueRef *pMVar1;
  iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_58;
  iterator local_40;
  
  local_58.bucket_index_ = first.it_.bucket_index_;
  local_58.node_ = first.it_.node_;
  local_58.m_ = first.it_.m_;
  while (local_58.node_ != last.it_.node_) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find
              (&local_40,(Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)this,
               &(((local_58.node_)->kv).v_)->first);
    if (local_40.it_.node_ == (Node *)0x0) {
      key = ((local_58.node_)->kv).v_;
      pMVar1 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                         ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)this,
                          &key->first);
      pMVar1->data_ = (key->second).data_;
      pMVar1->type_ = (key->second).type_;
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
    ::operator++(&local_58);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
    for (InputIt it = first; it != last; ++it) {
      iterator exist_it = find(it->first);
      if (exist_it == end()) {
        operator[](it->first) = it->second;
      }
    }
  }